

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O1

Tile mercatortile::parent(Tile *tile)

{
  uint uVar1;
  uint uVar2;
  Tile TVar3;
  
  uVar1 = tile->x;
  if ((uVar1 & 1) == 0) {
    uVar2 = tile->y;
    if ((uVar2 & 1) == 0) goto LAB_0010282b;
    if ((uVar1 & 1) == 0) {
      uVar2 = (tile->y - (tile->y + -1 >> 0x1f)) - 1;
      goto LAB_0010282b;
    }
  }
  uVar2 = tile->y;
  uVar1 = uVar1 - 1;
  if ((uVar2 & 1) != 0) {
    uVar1 = uVar1 - ((int)uVar1 >> 0x1f);
    uVar2 = uVar2 - 1;
  }
LAB_0010282b:
  TVar3.x = (int)uVar1 >> 1;
  TVar3.z = tile->z + -1;
  TVar3.y = (int)uVar2 >> 1;
  return TVar3;
}

Assistant:

Tile parent(const Tile &tile)
{
    Tile return_tile;
    if (tile.x % 2 == 0 && tile.y % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, tile.y / 2, tile.z - 1};
    }
    else if (tile.x % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, (tile.y - 1) / 2, tile.z - 1};
    }
    else if (!(tile.x % 2 == 0) && (tile.y % 2 == 0))
    {
        return_tile = Tile{(tile.x - 1) / 2, tile.y / 2, tile.z - 1};
    }
    else
    {
        return_tile = Tile{(tile.x - 1) / 2, (tile.y - 1) / 2, tile.z - 1};
    }

    return return_tile;
}